

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
     ::
     consume_impl<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>::consume_operation>
               (consume_operation *i_consume)

{
  value_type pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  runtime_type<> *this;
  Data *this_00;
  size_type sVar4;
  ulong uVar5;
  reference ppcVar6;
  ulong local_48;
  size_t i;
  value_type chars;
  char fill_char;
  unsigned_long size;
  size_t index;
  size_type count;
  Data *data;
  consume_operation *i_consume_local;
  
  this = density::
         sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
         ::consume_operation::complete_type((consume_operation *)i_consume);
  bVar3 = density::runtime_type<>::
          is<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
                    (this);
  if (!bVar3) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x198);
  }
  this_00 = density::
            sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
            ::consume_operation::
            element<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
                      ((consume_operation *)i_consume);
  sVar4 = std::vector<char_*,_std::allocator<char_*>_>::size(&this_00->m_blocks);
  exception_checkpoint();
  for (size = 0; size < sVar4; size = size + 1) {
    uVar5 = sVar4 - size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    ppcVar6 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this_00->m_blocks,size);
    pcVar1 = *ppcVar6;
    for (local_48 = 0; local_48 < uVar5; local_48 = local_48 + 1) {
      if (pcVar1[local_48] != (char)(SUB161(auVar2 % ZEXT816(10),0) + '0')) {
        assert_failed<>("chars[i] == fill_char",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                        ,0x1a6);
      }
    }
    if (pcVar1[uVar5] != '\0') {
      assert_failed<>("chars[size] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                      ,0x1a8);
    }
  }
  return;
}

Assistant:

static void consume_impl(const CONSUME_OPERATION & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());

                auto &     data  = i_consume.template element<ElementType>();
                auto const count = data.m_blocks.size();

                exception_checkpoint();

                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars     = data.m_blocks[index];
                    for (size_t i = 0; i < size; i++)
                    {
                        DENSITY_TEST_ASSERT(chars[i] == fill_char);
                    }
                    DENSITY_TEST_ASSERT(chars[size] == 0);
                }
            }